

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PpScanner.cpp
# Opt level: O0

int __thiscall glslang::TPpContext::lFloatConst(TPpContext *this,int len,int ch,TPpToken *ppToken)

{
  bool bVar1;
  int iVar2;
  bool bVar3;
  EShSource EVar4;
  int iVar5;
  TPpToken **__s;
  reference pvVar6;
  char *__s_00;
  ulong uVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  undefined4 uVar12;
  undefined4 uVar16;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  allocator<char> local_e9;
  string local_e8 [32];
  pool_allocator<char> local_c8;
  undefined1 local_c0 [8];
  TString numstr;
  int ch2_1;
  int ch2;
  bool isFloat16;
  bool isDouble;
  double expFactor;
  double dStack_78;
  int exponent;
  double exponentValue;
  int iStack_68;
  bool negativeExponent;
  int i_1;
  int endNonZeroDecimal;
  int startNonZeroDecimal;
  int firstDecimal;
  int iStack_54;
  bool hasDecimalOrExponent;
  int decimalShift;
  int i;
  unsigned_long_long wholeNumber;
  int iStack_40;
  bool fastPath;
  int numWholeNumberDigits;
  int endNonZero;
  int startNonZero;
  anon_class_16_2_97b877cd saveName;
  TPpToken *ppToken_local;
  int ch_local;
  int len_local;
  TPpContext *this_local;
  
  _endNonZero = (int *)((long)&ppToken_local + 4);
  saveName.len = (int *)&saveName.ppToken;
  numWholeNumberDigits = 0;
  while( true ) {
    bVar8 = false;
    if (numWholeNumberDigits < len) {
      bVar8 = ppToken->name[numWholeNumberDigits] == '0';
    }
    iStack_40 = len;
    if (!bVar8) break;
    numWholeNumberDigits = numWholeNumberDigits + 1;
  }
  while( true ) {
    bVar8 = false;
    if (numWholeNumberDigits < iStack_40) {
      bVar8 = ppToken->name[iStack_40 + -1] == '0';
    }
    if (!bVar8) break;
    iStack_40 = iStack_40 + -1;
  }
  wholeNumber._4_4_ = iStack_40 - numWholeNumberDigits;
  bVar8 = wholeNumber._4_4_ < 0x10;
  _decimalShift = 0;
  if (bVar8) {
    for (iStack_54 = numWholeNumberDigits; iStack_54 < iStack_40; iStack_54 = iStack_54 + 1) {
      _decimalShift = _decimalShift * 10 + (long)(ppToken->name[iStack_54] + -0x30);
    }
  }
  firstDecimal = len - iStack_40;
  bVar1 = false;
  saveName.ppToken = (TPpToken **)ppToken;
  ppToken_local._0_4_ = ch;
  ppToken_local._4_4_ = len;
  _ch_local = this;
  if (ch == 0x2e) {
    bVar1 = true;
    lFloatConst::anon_class_16_2_97b877cd::operator()((anon_class_16_2_97b877cd *)&endNonZero,0x2e);
    ppToken_local._0_4_ = getChar(this);
    iVar5 = ppToken_local._4_4_;
    if (((int)ppToken_local == 0x23) &&
       ((0 < this->ifdepth ||
        (EVar4 = TIntermediate::getSource((this->parseContext->super_TParseVersions).intermediate),
        EVar4 == EShSourceHlsl)))) {
      if ((ppToken_local._4_4_ < 2) ||
         ((((ppToken_local._4_4_ == 2 && (*(char *)(saveName.ppToken + 5) != '1')) ||
           ((ppToken_local._4_4_ == 3 &&
            (((*(char *)((long)saveName.ppToken + 0x29) != '1' &&
              (*(char *)(saveName.ppToken + 5) != '-')) && (*(char *)(saveName.ppToken + 5) != '+'))
            )))) || (3 < ppToken_local._4_4_)))) {
        (*(this->parseContext->super_TParseVersions)._vptr_TParseVersions[0x2f])
                  (this->parseContext,saveName.ppToken,"unexpected use of","#","");
      }
      else {
        ppToken_local._0_4_ = getChar(this);
        if ((((int)ppToken_local == 0x49) &&
            (ppToken_local._0_4_ = getChar(this), (int)ppToken_local == 0x4e)) &&
           (ppToken_local._0_4_ = getChar(this), (int)ppToken_local == 0x46)) {
          lFloatConst::anon_class_16_2_97b877cd::operator()
                    ((anon_class_16_2_97b877cd *)&endNonZero,0x49);
          lFloatConst::anon_class_16_2_97b877cd::operator()
                    ((anon_class_16_2_97b877cd *)&endNonZero,0x4e);
          lFloatConst::anon_class_16_2_97b877cd::operator()
                    ((anon_class_16_2_97b877cd *)&endNonZero,0x46);
          *(undefined1 *)((long)saveName.ppToken + (long)ppToken_local._4_4_ + 0x28) = 0;
          if (*(char *)(saveName.ppToken + 5) == '-') {
            saveName.ppToken[4] = (TPpToken *)0xfff0000000000000;
          }
          else {
            saveName.ppToken[4] = (TPpToken *)0x7ff0000000000000;
          }
          return 0x9e;
        }
        (*(this->parseContext->super_TParseVersions)._vptr_TParseVersions[0x2f])
                  (this->parseContext,saveName.ppToken,"expected \'INF\'","#","");
      }
    }
    while (iVar2 = ppToken_local._4_4_, (int)ppToken_local == 0x30) {
      lFloatConst::anon_class_16_2_97b877cd::operator()
                ((anon_class_16_2_97b877cd *)&endNonZero,0x30);
      ppToken_local._0_4_ = getChar(this);
    }
    iStack_68 = ppToken_local._4_4_;
    while (0x2f < (int)ppToken_local && (int)ppToken_local < 0x3a) {
      lFloatConst::anon_class_16_2_97b877cd::operator()
                ((anon_class_16_2_97b877cd *)&endNonZero,(int)ppToken_local);
      if ((int)ppToken_local != 0x30) {
        iStack_68 = ppToken_local._4_4_;
      }
      ppToken_local._0_4_ = getChar(this);
    }
    if (iVar2 < iStack_68) {
      wholeNumber._4_4_ = (iStack_68 - iStack_40) + -1 + wholeNumber._4_4_;
      bVar8 = wholeNumber._4_4_ < 0x10 && bVar8;
      if (bVar8) {
        for (exponentValue._4_4_ = iStack_40; exponentValue._4_4_ < iStack_68;
            exponentValue._4_4_ = exponentValue._4_4_ + 1) {
          if (*(char *)((long)saveName.ppToken + (long)exponentValue._4_4_ + 0x28) != '.') {
            _decimalShift =
                 _decimalShift * 10 +
                 (long)(*(char *)((long)saveName.ppToken + (long)exponentValue._4_4_ + 0x28) + -0x30
                       );
          }
        }
      }
      firstDecimal = iVar5 - iStack_68;
    }
  }
  bVar9 = false;
  dStack_78 = 0.0;
  expFactor._4_4_ = 0;
  if (((int)ppToken_local == 0x65) || ((int)ppToken_local == 0x45)) {
    bVar1 = true;
    lFloatConst::anon_class_16_2_97b877cd::operator()
              ((anon_class_16_2_97b877cd *)&endNonZero,(int)ppToken_local);
    ppToken_local._0_4_ = getChar(this);
    if (((int)ppToken_local == 0x2b) || ((int)ppToken_local == 0x2d)) {
      bVar9 = (int)ppToken_local == 0x2d;
      lFloatConst::anon_class_16_2_97b877cd::operator()
                ((anon_class_16_2_97b877cd *)&endNonZero,(int)ppToken_local);
      ppToken_local._0_4_ = getChar(this);
    }
    if (((int)ppToken_local < 0x30) || (0x39 < (int)ppToken_local)) {
      (*(this->parseContext->super_TParseVersions)._vptr_TParseVersions[0x2f])
                (this->parseContext,saveName.ppToken,"bad character in float exponent","");
    }
    else {
      while (0x2f < (int)ppToken_local && (int)ppToken_local < 0x3a) {
        if ((int)expFactor._4_4_ < 500) {
          expFactor._4_4_ = expFactor._4_4_ * 10 + (int)ppToken_local + -0x30;
        }
        lFloatConst::anon_class_16_2_97b877cd::operator()
                  ((anon_class_16_2_97b877cd *)&endNonZero,(int)ppToken_local);
        ppToken_local._0_4_ = getChar(this);
      }
    }
  }
  if (bVar9) {
    expFactor._4_4_ = expFactor._4_4_ - firstDecimal;
  }
  else {
    expFactor._4_4_ = firstDecimal + expFactor._4_4_;
    if ((int)expFactor._4_4_ < 0) {
      bVar9 = true;
      expFactor._4_4_ = -expFactor._4_4_;
    }
  }
  if (0x16 < (int)expFactor._4_4_) {
    bVar8 = false;
  }
  if ((bVar8) && (dStack_78 = 1.0, 0 < (int)expFactor._4_4_)) {
    _ch2 = 10.0;
    for (; 0 < (int)expFactor._4_4_; expFactor._4_4_ = (int)expFactor._4_4_ >> 1) {
      if ((expFactor._4_4_ & 1) != 0) {
        dStack_78 = _ch2 * dStack_78;
      }
      _ch2 = _ch2 * _ch2;
    }
  }
  bVar10 = false;
  bVar11 = false;
  if (((int)ppToken_local == 0x6c) || ((int)ppToken_local == 0x4c)) {
    if ((this->ifdepth == 0) &&
       (EVar4 = TIntermediate::getSource((this->parseContext->super_TParseVersions).intermediate),
       EVar4 == EShSourceGlsl)) {
      (*(this->parseContext->super_TParseVersions)._vptr_TParseVersions[0x11])
                (this->parseContext,saveName.ppToken,"double floating-point suffix");
    }
    if ((this->ifdepth == 0) && (!bVar1)) {
      (*(this->parseContext->super_TParseVersions)._vptr_TParseVersions[0x2f])
                (this->parseContext,saveName.ppToken,
                 "float literal needs a decimal point or exponent","");
    }
    EVar4 = TIntermediate::getSource((this->parseContext->super_TParseVersions).intermediate);
    if (EVar4 == EShSourceGlsl) {
      iVar5 = getChar(this);
      if ((iVar5 == 0x66) || (iVar5 == 0x46)) {
        lFloatConst::anon_class_16_2_97b877cd::operator()
                  ((anon_class_16_2_97b877cd *)&endNonZero,(int)ppToken_local);
        lFloatConst::anon_class_16_2_97b877cd::operator()
                  ((anon_class_16_2_97b877cd *)&endNonZero,iVar5);
        bVar10 = true;
      }
      else {
        ungetChar(this);
        ungetChar(this);
      }
    }
    else {
      EVar4 = TIntermediate::getSource((this->parseContext->super_TParseVersions).intermediate);
      bVar10 = EVar4 == EShSourceHlsl;
      if (bVar10) {
        lFloatConst::anon_class_16_2_97b877cd::operator()
                  ((anon_class_16_2_97b877cd *)&endNonZero,(int)ppToken_local);
      }
    }
  }
  else if (((int)ppToken_local == 0x68) || ((int)ppToken_local == 0x48)) {
    if ((this->ifdepth == 0) &&
       (EVar4 = TIntermediate::getSource((this->parseContext->super_TParseVersions).intermediate),
       EVar4 == EShSourceGlsl)) {
      (*(this->parseContext->super_TParseVersions)._vptr_TParseVersions[0x12])
                (this->parseContext,saveName.ppToken,"half floating-point suffix",0);
    }
    if ((this->ifdepth == 0) && (!bVar1)) {
      (*(this->parseContext->super_TParseVersions)._vptr_TParseVersions[0x2f])
                (this->parseContext,saveName.ppToken,
                 "float literal needs a decimal point or exponent","");
    }
    EVar4 = TIntermediate::getSource((this->parseContext->super_TParseVersions).intermediate);
    if (EVar4 == EShSourceGlsl) {
      numstr.field_2._12_4_ = getChar(this);
      if ((numstr.field_2._12_4_ == 0x66) || (numstr.field_2._12_4_ == 0x46)) {
        lFloatConst::anon_class_16_2_97b877cd::operator()
                  ((anon_class_16_2_97b877cd *)&endNonZero,(int)ppToken_local);
        lFloatConst::anon_class_16_2_97b877cd::operator()
                  ((anon_class_16_2_97b877cd *)&endNonZero,numstr.field_2._12_4_);
        bVar11 = true;
      }
      else {
        ungetChar(this);
        ungetChar(this);
      }
    }
    else {
      EVar4 = TIntermediate::getSource((this->parseContext->super_TParseVersions).intermediate);
      bVar11 = EVar4 == EShSourceHlsl;
      if (bVar11) {
        lFloatConst::anon_class_16_2_97b877cd::operator()
                  ((anon_class_16_2_97b877cd *)&endNonZero,(int)ppToken_local);
      }
    }
  }
  else if (((int)ppToken_local == 0x66) || ((int)ppToken_local == 0x46)) {
    if (this->ifdepth == 0) {
      TParseVersions::profileRequires
                (&this->parseContext->super_TParseVersions,(TSourceLoc *)saveName.ppToken,8,300,
                 (char *)0x0,"floating-point suffix");
    }
    if ((this->ifdepth == 0) &&
       (bVar3 = TParseVersions::relaxedErrors(&this->parseContext->super_TParseVersions), !bVar3)) {
      TParseVersions::profileRequires
                (&this->parseContext->super_TParseVersions,(TSourceLoc *)saveName.ppToken,-9,0x78,
                 (char *)0x0,"floating-point suffix");
    }
    if ((this->ifdepth == 0) && (!bVar1)) {
      (*(this->parseContext->super_TParseVersions)._vptr_TParseVersions[0x2f])
                (this->parseContext,saveName.ppToken,
                 "float literal needs a decimal point or exponent","");
    }
    lFloatConst::anon_class_16_2_97b877cd::operator()
              ((anon_class_16_2_97b877cd *)&endNonZero,(int)ppToken_local);
  }
  else {
    ungetChar(this);
  }
  if (0x400 < ppToken_local._4_4_) {
    ppToken_local._4_4_ = 0x400;
    (*(this->parseContext->super_TParseVersions)._vptr_TParseVersions[0x2f])
              (this->parseContext,saveName.ppToken,"float literal too long","");
  }
  *(undefined1 *)((long)saveName.ppToken + (long)ppToken_local._4_4_ + 0x28) = 0;
  if (bVar8) {
    uVar12 = (undefined4)_decimalShift;
    uVar16 = (undefined4)((ulong)_decimalShift >> 0x20);
    if ((dStack_78 != 0.0) || (NAN(dStack_78))) {
      if (bVar9) {
        auVar14._8_4_ = uVar16;
        auVar14._0_8_ = _decimalShift;
        auVar14._12_4_ = 0x45300000;
        saveName.ppToken[4] =
             (TPpToken *)
             (((auVar14._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,uVar12) - 4503599627370496.0)) / dStack_78);
      }
      else {
        auVar15._8_4_ = uVar16;
        auVar15._0_8_ = _decimalShift;
        auVar15._12_4_ = 0x45300000;
        saveName.ppToken[4] =
             (TPpToken *)
             (((auVar15._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,uVar12) - 4503599627370496.0)) * dStack_78);
      }
    }
    else {
      auVar13._8_4_ = uVar16;
      auVar13._0_8_ = _decimalShift;
      auVar13._12_4_ = 0x45300000;
      saveName.ppToken[4] =
           (TPpToken *)
           ((auVar13._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,uVar12) - 4503599627370496.0));
    }
  }
  else {
    saveName.ppToken[4] = (TPpToken *)0x0;
    __s = saveName.ppToken + 5;
    pool_allocator<char>::pool_allocator(&local_c8);
    std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
    basic_string<glslang::std::allocator<char>>
              ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)local_c0,
               (char *)__s,&local_c8);
    pvVar6 = std::__cxx11::
             basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::back
                       ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                         *)local_c0);
    if ((*pvVar6 == 'f') ||
       (pvVar6 = std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::back
                           ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                             *)local_c0), *pvVar6 == 'F')) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      pop_back((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
               local_c0);
    }
    pvVar6 = std::__cxx11::
             basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::back
                       ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                         *)local_c0);
    if ((*pvVar6 == 'h') ||
       (pvVar6 = std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::back
                           ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                             *)local_c0), *pvVar6 == 'H')) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      pop_back((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
               local_c0);
    }
    pvVar6 = std::__cxx11::
             basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::back
                       ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                         *)local_c0);
    if ((*pvVar6 == 'l') ||
       (pvVar6 = std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::back
                           ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                             *)local_c0), *pvVar6 == 'L')) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      pop_back((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
               local_c0);
    }
    std::ios::clear((int)this + 0x248 + (int)*(undefined8 *)(*(long *)&this->strtodStream + -0x18));
    __s_00 = std::__cxx11::
             basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                         *)local_c0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_e8,__s_00,&local_e9);
    std::__cxx11::istringstream::str((string *)&this->strtodStream);
    std::__cxx11::string::~string(local_e8);
    std::allocator<char>::~allocator(&local_e9);
    std::istream::operator>>(&this->strtodStream,(double *)(saveName.ppToken + 4));
    uVar7 = std::ios::fail();
    if ((uVar7 & 1) != 0) {
      if ((!bVar9) && (300 < (int)(expFactor._4_4_ + wholeNumber._4_4_))) {
        saveName.ppToken[4] = (TPpToken *)0x7ff0000000000000;
      }
      if ((bVar9) && (300 < (int)(expFactor._4_4_ + wholeNumber._4_4_))) {
        saveName.ppToken[4] = (TPpToken *)0x0;
      }
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
    ~basic_string((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                  local_c0);
  }
  if (bVar10) {
    this_local._4_4_ = 0x9f;
  }
  else if (bVar11) {
    this_local._4_4_ = 0xa0;
  }
  else {
    this_local._4_4_ = 0x9e;
  }
  return this_local._4_4_;
}

Assistant:

int TPpContext::lFloatConst(int len, int ch, TPpToken* ppToken)
{
    const auto saveName = [&](int ch) {
        if (len <= MaxTokenLength)
            ppToken->name[len++] = static_cast<char>(ch);
    };

    // find the range of non-zero digits before the decimal point
    int startNonZero = 0;
    while (startNonZero < len && ppToken->name[startNonZero] == '0')
        ++startNonZero;
    int endNonZero = len;
    while (endNonZero > startNonZero && ppToken->name[endNonZero-1] == '0')
        --endNonZero;
    int numWholeNumberDigits = endNonZero - startNonZero;

    // accumulate the range's value
    bool fastPath = numWholeNumberDigits <= 15;  // when the number gets too complex, set to false
    unsigned long long wholeNumber = 0;
    if (fastPath) {
        for (int i = startNonZero; i < endNonZero; ++i)
            wholeNumber = wholeNumber * 10 + (ppToken->name[i] - '0');
    }
    int decimalShift = len - endNonZero;

    // Decimal point:
    bool hasDecimalOrExponent = false;
    if (ch == '.') {
        hasDecimalOrExponent = true;
        saveName(ch);
        ch = getChar();
        int firstDecimal = len;

#ifdef ENABLE_HLSL
        // 1.#INF or -1.#INF
        if (ch == '#' && (ifdepth > 0 || parseContext.intermediate.getSource() == EShSourceHlsl)) {
            if ((len <  2) ||
                (len == 2 && ppToken->name[0] != '1') ||
                (len == 3 && ppToken->name[1] != '1' && !(ppToken->name[0] == '-' || ppToken->name[0] == '+')) ||
                (len >  3))
                parseContext.ppError(ppToken->loc, "unexpected use of", "#", "");
            else {
                // we have 1.# or -1.# or +1.#, check for 'INF'
                if ((ch = getChar()) != 'I' ||
                    (ch = getChar()) != 'N' ||
                    (ch = getChar()) != 'F')
                    parseContext.ppError(ppToken->loc, "expected 'INF'", "#", "");
                else {
                    // we have [+-].#INF, and we are targeting IEEE 754, so wrap it up:
                    saveName('I');
                    saveName('N');
                    saveName('F');
                    ppToken->name[len] = '\0';
                    if (ppToken->name[0] == '-')
                        ppToken->i64val = 0xfff0000000000000; // -Infinity
                    else
                        ppToken->i64val = 0x7ff0000000000000; // +Infinity
                    return PpAtomConstFloat;
                }
            }
        }
#endif

        // Consume leading-zero digits after the decimal point
        while (ch == '0') {
            saveName(ch);
            ch = getChar();
        }
        int startNonZeroDecimal = len;
        int endNonZeroDecimal = len;

        // Consume remaining digits, up to the exponent
        while (ch >= '0' && ch <= '9') {
            saveName(ch);
            if (ch != '0')
                endNonZeroDecimal = len;
            ch = getChar();
        }

        // Compute accumulation up to the last non-zero digit
        if (endNonZeroDecimal > startNonZeroDecimal) {
            numWholeNumberDigits += endNonZeroDecimal - endNonZero - 1; // don't include the "."
            if (numWholeNumberDigits > 15)
                fastPath = false;
            if (fastPath) {
                for (int i = endNonZero; i < endNonZeroDecimal; ++i) {
                    if (ppToken->name[i] != '.')
                        wholeNumber = wholeNumber * 10 + (ppToken->name[i] - '0');
                }
            }
            decimalShift = firstDecimal - endNonZeroDecimal;
        }
    }

    // Exponent:
    bool negativeExponent = false;
    double exponentValue = 0.0;
    int exponent = 0;
    {
        if (ch == 'e' || ch == 'E') {
            hasDecimalOrExponent = true;
            saveName(ch);
            ch = getChar();
            if (ch == '+' || ch == '-') {
                negativeExponent = ch == '-';
                saveName(ch);
                ch = getChar();
            }
            if (ch >= '0' && ch <= '9') {
                while (ch >= '0' && ch <= '9') {
                    if (exponent < 500) {
                        exponent = exponent * 10 + (ch - '0');
                    }
                    saveName(ch);
                    ch = getChar();
                }
            } else {
                parseContext.ppError(ppToken->loc, "bad character in float exponent", "", "");
            }
        }

        // Compensate for location of decimal
        if (negativeExponent)
            exponent -= decimalShift;
        else {
            exponent += decimalShift;
            if (exponent < 0) {
                negativeExponent = true;
                exponent = -exponent;
            }
        }
        if (exponent > 22)
            fastPath = false;

        if (fastPath) {
            // Compute the floating-point value of the exponent
            exponentValue = 1.0;
            if (exponent > 0) {
                double expFactor = 10;
                while (exponent > 0) {
                    if (exponent & 0x1)
                        exponentValue *= expFactor;
                    expFactor *= expFactor;
                    exponent >>= 1;
                }
            }
        }
    }

    // Suffix:
    bool isDouble = false;
    bool isFloat16 = false;
    if (ch == 'l' || ch == 'L') {
        if (ifdepth == 0 && parseContext.intermediate.getSource() == EShSourceGlsl)
            parseContext.doubleCheck(ppToken->loc, "double floating-point suffix");
        if (ifdepth == 0 && !hasDecimalOrExponent)
            parseContext.ppError(ppToken->loc, "float literal needs a decimal point or exponent", "", "");
        if (parseContext.intermediate.getSource() == EShSourceGlsl) {
            int ch2 = getChar();
            if (ch2 != 'f' && ch2 != 'F') {
                ungetChar();
                ungetChar();
            } else {
                saveName(ch);
                saveName(ch2);
                isDouble = true;
            }
        } else if (parseContext.intermediate.getSource() == EShSourceHlsl) {
            saveName(ch);
            isDouble = true;
        }
    } else if (ch == 'h' || ch == 'H') {
        if (ifdepth == 0 && parseContext.intermediate.getSource() == EShSourceGlsl)
            parseContext.float16Check(ppToken->loc, "half floating-point suffix");
        if (ifdepth == 0 && !hasDecimalOrExponent)
            parseContext.ppError(ppToken->loc, "float literal needs a decimal point or exponent", "", "");
        if (parseContext.intermediate.getSource() == EShSourceGlsl) {
            int ch2 = getChar();
            if (ch2 != 'f' && ch2 != 'F') {
                ungetChar();
                ungetChar();
            } else {
                saveName(ch);
                saveName(ch2);
                isFloat16 = true;
            }
        } else if (parseContext.intermediate.getSource() == EShSourceHlsl) {
            saveName(ch);
            isFloat16 = true;
        }
    } else
    if (ch == 'f' || ch == 'F') {
        if (ifdepth == 0)
            parseContext.profileRequires(ppToken->loc,  EEsProfile, 300, nullptr, "floating-point suffix");
        if (ifdepth == 0 && !parseContext.relaxedErrors())
            parseContext.profileRequires(ppToken->loc, ~EEsProfile, 120, nullptr, "floating-point suffix");
        if (ifdepth == 0 && !hasDecimalOrExponent)
            parseContext.ppError(ppToken->loc, "float literal needs a decimal point or exponent", "", "");
        saveName(ch);
    } else
        ungetChar();

    // Patch up the name and length for overflow

    if (len > MaxTokenLength) {
        len = MaxTokenLength;
        parseContext.ppError(ppToken->loc, "float literal too long", "", "");
    }
    ppToken->name[len] = '\0';

    // Compute the numerical value
    if (fastPath) {
        // compute the floating-point value of the exponent
        if (exponentValue == 0.0)
            ppToken->dval = (double)wholeNumber;
        else if (negativeExponent)
            ppToken->dval = (double)wholeNumber / exponentValue;
        else
            ppToken->dval = (double)wholeNumber * exponentValue;
    } else {
        // slow path
        ppToken->dval = 0.0;

        // remove suffix
        TString numstr(ppToken->name);
        if (numstr.back() == 'f' || numstr.back() == 'F')
            numstr.pop_back();
        if (numstr.back() == 'h' || numstr.back() == 'H')
            numstr.pop_back();
        if (numstr.back() == 'l' || numstr.back() == 'L')
            numstr.pop_back();

        // use platform library
        strtodStream.clear();
        strtodStream.str(numstr.c_str());
        strtodStream >> ppToken->dval;
        if (strtodStream.fail()) {
            // Assume failure combined with a large exponent was overflow, in
            // an attempt to set INF.
            if (!negativeExponent && exponent + numWholeNumberDigits > 300)
                ppToken->i64val = 0x7ff0000000000000; // +Infinity
            // Assume failure combined with a small exponent was overflow.
            if (negativeExponent && exponent + numWholeNumberDigits > 300)
                ppToken->dval = 0.0;
            // Unknown reason for failure. Theory is that either
            //  - the 0.0 is still there, or
            //  - something reasonable was written that is better than 0.0
        }
    }

    // Return the right token type
    if (isDouble)
        return PpAtomConstDouble;
    else if (isFloat16)
        return PpAtomConstFloat16;
    else
        return PpAtomConstFloat;
}